

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O0

void day2b::run(void)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_28 [8];
  string input;
  
  read_file_abi_cxx11_((string *)local_28,"input/day2.txt");
  std::operator<<((ostream *)&std::cout,"day2b ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  iVar1 = get_bathroom_code((string *)local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,'\n');
  std::ostream::operator<<((ostream *)&std::cout,std::dec);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day2.txt");
		std::cout << "day2b ";
		std::cout << std::hex << get_bathroom_code(input) << '\n';
		//std::cout << std::hex << get_bathroom_code("ULL\nRRDDD\nLURDL\nUUUUD") << '\n';
		std::cout << std::dec;
	}